

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::regrid(Amr *this,int lbase,Real time,bool initial)

{
  ofstream *os;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var1;
  pointer puVar2;
  tuple<amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> tVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer piVar5;
  char cVar6;
  pointer pBVar7;
  undefined1 auVar8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  bool bVar10;
  long *plVar11;
  ostream *poVar12;
  int iVar13;
  uint min_lev;
  long lVar14;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar15;
  long lVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  byte bVar26;
  int new_finest;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> new_grid_places;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> new_dmap;
  uint local_234;
  long local_230;
  undefined4 local_228;
  char local_221;
  ulong local_220;
  Amr *local_218;
  Real local_210;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_208;
  ulong local_1f0;
  long local_1e8;
  ulong local_1e0;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> local_1d8;
  long local_1c0;
  undefined1 local_1b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  pointer local_1a8;
  undefined8 auStack_1a0 [46];
  
  bVar26 = 0;
  local_228 = (undefined4)CONCAT71(in_register_00000011,initial);
  iVar19 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  iVar13 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  if (iVar19 + -1 < iVar13) {
    iVar13 = iVar19 + -1;
  }
  if (iVar13 < lbase) {
    return;
  }
  local_210 = time;
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)OutStream();
    local_1b8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
    local_1b8._0_4_ = *(int *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    *(undefined8 *)((long)auStack_1a0 + *(long *)local_1a8[-2].vect) =
         *(undefined8 *)
          ((long)&p_Stack_1b0->_M_use_count + (long)p_Stack_1b0->_vptr__Sp_counted_base[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Now regridding at level lbase = ",0x20);
    std::ostream::operator<<((ostringstream *)&local_1a8,lbase);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
    Print::~Print((Print *)local_1b8);
    iVar19 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            (&local_208,(long)(iVar19 + 1),(allocator_type *)local_1b8);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            (&local_1d8,(long)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + 1,
             (allocator_type *)local_1b8);
  grid_places(this,lbase,local_210,(int *)&local_234,
              (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_208);
  uVar15 = extraout_RDX;
  if ((lbase == 0 & ((byte)local_228 ^ 1)) == 0) {
    min_lev = lbase + 1;
  }
  else {
    if (this->loadbalance_with_workestimates == 0) {
      bVar10 = BoxArray::operator!=
                         (local_208.
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (BoxArray *)
                          ((long)(((this->amr_level).
                                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   .
                                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          + 0xd8));
      min_lev = 1;
      uVar15 = extraout_RDX_00;
      if (!bVar10) goto LAB_005b20a7;
    }
    min_lev = 0;
  }
LAB_005b20a7:
  uVar20 = *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  local_220 = CONCAT44(local_220._4_4_,(int)CONCAT71((int7)((ulong)uVar15 >> 8),uVar20 == local_234)
                      );
  if ((int)local_234 < (int)uVar20) {
    uVar20 = local_234;
  }
  local_218 = this;
  local_1f0 = (ulong)(uint)lbase;
  if ((int)min_lev <= (int)uVar20) {
    lVar22 = (long)(int)min_lev;
    lVar25 = lVar22 * 0x68;
    lVar16 = lVar22 * 8;
    uVar23 = lVar22 << 4 | 8;
    iVar19 = (uVar20 - min_lev) + 1;
    do {
      bVar10 = BoxArray::operator==
                         ((BoxArray *)
                          ((long)&((local_208.
                                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                          lVar25),(BoxArray *)
                                  (*(long *)((long)&(((this->amr_level).
                                                                                                            
                                                  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                                  .
                                                  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                            + lVar16) + 0xd8));
      pBVar7 = local_208.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (bVar10) {
        local_230 = CONCAT44(local_230._4_4_,iVar19);
        lVar22 = *(long *)((long)&(((this->amr_level).
                                    super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                    .
                                    super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          + lVar16);
        puVar17 = (undefined8 *)(lVar22 + 0xd8);
        puVar18 = (undefined8 *)
                  ((long)&((local_208.
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + lVar25);
        for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar18 = *puVar17;
          puVar17 = puVar17 + (ulong)bVar26 * -2 + 1;
          puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
        }
        this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&((local_208.
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            _M_impl.super__Vector_impl_data._M_start)->m_ref).
                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi + lVar25);
        this_00[-1]._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar22 + 0x120);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_00,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar22 + 0x128));
        this = local_218;
        this_00[1]._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar22 + 0x130);
        iVar19 = (int)local_230;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pBVar7->m_simplified_list).
                           super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + lVar25),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar22 + 0x138));
        lVar22 = *(long *)((long)&(((this->amr_level).
                                    super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                    .
                                    super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          + lVar16);
        *(undefined8 *)
         ((long)&((local_1d8.
                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + lVar16 * 2) = *(undefined8 *)(lVar22 + 0x140);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((local_1d8.
                             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + uVar23),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar22 + 0x148));
      }
      else {
        local_220 = local_220 & 0xffffffff00000000;
      }
      lVar25 = lVar25 + 0x68;
      lVar16 = lVar16 + 8;
      uVar23 = uVar23 + 0x10;
      iVar19 = iVar19 + -1;
    } while (iVar19 != 0);
  }
  uVar23 = local_1f0;
  if (((byte)local_220 & (anonymous_namespace)::use_efficient_regrid == 1) == 0) {
    iVar19 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    if ((int)min_lev <= iVar19) {
      lVar16 = (long)(int)min_lev + -1;
      do {
        _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar16 + 1]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        if (*(int *)((long)_Var1.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x20c) ==
            0) {
          (**(code **)(*(long *)_Var1.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd0
                      ))();
          iVar19 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < iVar19);
    }
    if ((int)local_234 < iVar19) {
      lVar16 = (long)(int)local_234;
      uVar20 = local_234;
      do {
        uVar20 = uVar20 + 1;
        puVar2 = (this->amr_level).
                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar3.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> *)
              &puVar2[lVar16 + 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        puVar2[lVar16 + 1]._M_t.
        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> =
             (__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>)0x0;
        if (tVar3.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
            super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::AmrLevel_*,_false>)0x0) {
          (**(code **)(*(long *)tVar3.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 8))
                    ();
        }
        lVar16 = lVar16 + 1;
        AmrMesh::ClearBoxArray((AmrMesh *)this,uVar20);
        AmrMesh::ClearDistributionMap((AmrMesh *)this,uVar20);
      } while (lVar16 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
    uVar21 = (ulong)local_234;
    *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c = local_234;
    if ((int)min_lev <= (int)local_234) {
      local_1e8 = (long)(int)min_lev;
      local_230 = local_1e8 * 8;
      local_1e0 = (ulong)min_lev;
      lVar22 = local_1e8 << 4;
      lVar25 = local_1e8 * 0x68;
      local_1c0 = local_1e8 * 4;
      uVar24 = local_1e8 * 200;
      lVar16 = 0;
      do {
        if (this->loadbalance_with_workestimates == 0 || (char)local_228 != '\0') {
          plVar4 = *(long **)((long)&((local_1d8.
                                       super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                                     super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + lVar22);
          if (*plVar4 == plVar4[1]) {
            DistributionMapping::define
                      ((DistributionMapping *)
                       ((long)&((local_1d8.
                                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar22),
                       (BoxArray *)
                       ((long)&((local_208.
                                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                       lVar25),*(int *)(ParallelContext::frames + 0x10));
          }
        }
        else {
          makeLoadBalanceDistributionMap
                    ((Amr *)local_1b8,(int)this,local_210,
                     (BoxArray *)(ulong)(uint)((int)local_1e0 + (int)lVar16));
          p_Var9 = p_Stack_1b0;
          auVar8 = local_1b8;
          local_1b8 = (undefined1  [8])0x0;
          p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&((local_1d8.
                               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + lVar22);
          puVar17 = (undefined8 *)
                    ((long)&((local_1d8.
                              super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + lVar22);
          *puVar17 = auVar8;
          puVar17[1] = p_Var9;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
          }
        }
        iVar19 = (int)(local_1e0 + lVar16);
        plVar11 = (long *)(**(code **)(*(long *)this->levelbld + 0x30))
                                    (SUB84(this->cumtime,0),this->levelbld,this,
                                     local_1e0 + lVar16 & 0xffffffff,
                                     (long)(((this->super_AmrCore).super_AmrMesh.geom.
                                             super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                             .
                                             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super_CoordSys).offset + uVar24 + 0xfffffffffffffff8,
                                     (long)&((local_208.
                                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_bat).
                                            m_bat_type + lVar25,
                                     (long)&((local_1d8.
                                              super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                                            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + lVar22);
        puVar2 = (this->amr_level).
                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar4 = *(long **)((long)&puVar2[lVar16]._M_t.
                                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           + local_230);
        local_220 = uVar24;
        if ((char)local_228 == '\0') {
          if (plVar4 == (long *)0x0) {
            (**(code **)(*plVar11 + 0xe0))(plVar11);
            puVar2 = (local_218->amr_level).
                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            plVar4 = *(long **)((long)&puVar2[lVar16]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               + local_230);
            *(long **)((long)&puVar2[lVar16]._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                      + local_230) = plVar11;
            if (plVar4 != (long *)0x0) {
              (**(code **)(*plVar4 + 8))();
            }
            this = local_218;
            if (0 < local_1e8 + lVar16) {
              piVar5 = (local_218->level_steps).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              *(int *)((long)piVar5 + lVar16 * 4 + local_1c0) =
                   *(int *)((long)(local_218->n_cycle).super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar16 * 4 + local_1c0 + -4) *
                   *(int *)((long)piVar5 + lVar16 * 4 + local_1c0 + -4);
            }
          }
          else {
            (**(code **)(*plVar11 + 0xd8))(plVar11);
            this = local_218;
            puVar2 = (local_218->amr_level).
                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            plVar4 = *(long **)((long)&puVar2[lVar16]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               + local_230);
            *(long **)((long)&puVar2[lVar16]._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                      + local_230) = plVar11;
            if (plVar4 != (long *)0x0) {
              (**(code **)(*plVar4 + 8))();
            }
          }
          lVar14 = local_230;
          AmrMesh::SetBoxArray
                    ((AmrMesh *)this,iVar19,
                     (BoxArray *)
                     (*(long *)((long)&(this->amr_level).
                                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               + local_230) + 0xd8));
          AmrMesh::SetDistributionMap
                    ((AmrMesh *)this,iVar19,
                     (DistributionMapping *)
                     (*(long *)((long)&(this->amr_level).
                                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               + lVar14) + 0x140));
        }
        else {
          *(long **)((long)&puVar2[lVar16]._M_t.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                    + local_230) = plVar11;
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar4 + 8))(plVar4);
          }
          this = local_218;
          lVar14 = local_230;
          AmrMesh::SetBoxArray
                    ((AmrMesh *)local_218,iVar19,
                     (BoxArray *)
                     (*(long *)((long)&(local_218->amr_level).
                                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               + local_230) + 0xd8));
          AmrMesh::SetDistributionMap
                    ((AmrMesh *)this,iVar19,
                     (DistributionMapping *)
                     (*(long *)((long)&(this->amr_level).
                                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               + lVar14) + 0x140));
          (**(code **)(**(long **)((long)&(this->amr_level).
                                          super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                          .
                                          super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  + lVar14) + 0xb8))();
        }
        uVar21 = (ulong)(int)local_234;
        lVar14 = local_1e8 + lVar16;
        lVar16 = lVar16 + 1;
        lVar22 = lVar22 + 0x10;
        lVar25 = lVar25 + 0x68;
        uVar24 = local_220 + 200;
        uVar23 = local_1f0;
      } while (lVar14 < (long)uVar21);
    }
    iVar19 = (int)uVar23;
    if (-1 < (int)uVar21) {
      lVar16 = -1;
      do {
        _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar16 + 1]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        (**(code **)(*(long *)_Var1.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x98))
                  (_Var1.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,uVar23 & 0xffffffff,
                   uVar21 & 0xffffffff);
        uVar21 = (ulong)(int)local_234;
        lVar16 = lVar16 + 1;
      } while (lVar16 < (long)uVar21);
    }
    if ((this->record_run_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
      os = &this->runlog;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,"REGRID: at level lbase = ",0x19);
      poVar12 = (ostream *)std::ostream::operator<<(os,iVar19);
      local_1b8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_1b8,1);
      printGridInfo(this,(ostream *)os,min_lev,
                    *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
    if ((this->record_grid_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
      if (iVar19 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->gridlog,"STEP = ",7);
        poVar12 = (ostream *)
                  std::ostream::operator<<
                            (&this->gridlog,
                             *(this->level_steps).super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        local_1b8[0] = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_1b8,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->gridlog,"TIME = ",7);
      poVar12 = std::ostream::_M_insert<double>(local_210);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," : REGRID  with lbase = ",0x18);
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar19);
      local_1b8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_1b8,1);
      printGridInfo(this,(ostream *)&this->gridlog,min_lev,
                    *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
    if ((0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) &&
       (*(int *)(ParallelContext::frames + 0xc) == 0)) {
      if (iVar19 == 0) {
        p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)OutStream();
        local_1b8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
        local_1b8._0_4_ = *(int *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        *(undefined8 *)((long)auStack_1a0 + *(long *)local_1a8[-2].vect) =
             *(undefined8 *)
              ((long)&p_Stack_1b0->_M_use_count + (long)p_Stack_1b0->_vptr__Sp_counted_base[-3]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"STEP = ",7);
        std::ostream::operator<<
                  ((ostringstream *)&local_1a8,
                   *(this->level_steps).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start);
        local_221 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,&local_221,1);
        Print::~Print((Print *)local_1b8);
      }
      p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)OutStream();
      local_1b8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
      local_1b8._0_4_ = *(int *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      *(undefined8 *)((long)auStack_1a0 + *(long *)local_1a8[-2].vect) =
           *(undefined8 *)
            ((long)&p_Stack_1b0->_M_use_count + (long)p_Stack_1b0->_vptr__Sp_counted_base[-3]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"TIME = ",7);
      std::ostream::_M_insert<double>(local_210);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," : REGRID  with lbase = ",0x18);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar19);
      cVar6 = (char)(ostringstream *)&local_1a8;
      std::ios::widen((char)*(undefined8 *)local_1a8[-2].vect + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      Print::~Print((Print *)local_1b8);
      if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose < 2) {
        poVar12 = OutStream();
        AmrCore::printGridSummary
                  (&this->super_AmrCore,poVar12,min_lev,
                   *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
      else {
        poVar12 = OutStream();
        printGridInfo(this,poVar12,min_lev,
                      *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
    }
  }
  else if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)OutStream();
    local_1b8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
    local_1b8._0_4_ = *(int *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    *(undefined8 *)((long)auStack_1a0 + *(long *)local_1a8[-2].vect) =
         *(undefined8 *)
          ((long)&p_Stack_1b0->_M_use_count + (long)p_Stack_1b0->_vptr__Sp_counted_base[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Regridding at level lbase = ",0x1c);
    std::ostream::operator<<((ostringstream *)&local_1a8,(int)uVar23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," but grids unchanged\n",0x15);
    Print::~Print((Print *)local_1b8);
  }
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            (&local_1d8);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_208);
  return;
}

Assistant:

void
Amr::regrid (int  lbase,
             Real time,
             bool initial)
{
    BL_PROFILE("Amr::regrid()");

    if (lbase > std::min(finest_level,max_level-1)) return;

    if (verbose > 0)
        amrex::Print() << "Now regridding at level lbase = " << lbase << "\n";

    //
    // Compute positions of new grids.
    //
    int             new_finest;
    Vector<BoxArray> new_grid_places(max_level+1);
    Vector<DistributionMapping> new_dmap(max_level+1);

    grid_places(lbase,time,new_finest, new_grid_places);

    bool regrid_level_zero = (!initial) && (lbase == 0)
        && ( loadbalance_with_workestimates || (new_grid_places[0] != amr_level[0]->boxArray()));

    const int start = regrid_level_zero ? 0 : lbase+1;

    bool grids_unchanged = finest_level == new_finest;
    for (int lev = start, End = std::min(finest_level,new_finest); lev <= End; lev++) {
        if (new_grid_places[lev] == amr_level[lev]->boxArray()) {
            new_grid_places[lev] = amr_level[lev]->boxArray();  // to avoid duplicates
            new_dmap[lev] = amr_level[lev]->DistributionMap();
        } else {
            grids_unchanged = false;
        }
    }

    //
    // If use_efficient_regrid flag is set and grids are unchanged, then don't do anything more here.
    //
    if (use_efficient_regrid == 1 && grids_unchanged )
    {
        if (verbose > 0) {
            amrex::Print() << "Regridding at level lbase = " << lbase
                           << " but grids unchanged\n";
        }
        return;
    }

    //
    // Reclaim old-time grid space for all remain levels > lbase.
    // But skip this if we're in the middle of a post-timestep regrid.
    //
    for(int lev = start; lev <= finest_level; ++lev) {
        if (!amr_level[lev]->postStepRegrid()) {
            amr_level[lev]->removeOldData();
        }
    }
    //
    // Reclaim all remaining storage for levels > new_finest.
    //
    for(int lev = new_finest + 1; lev <= finest_level; ++lev) {
        amr_level[lev].reset();
        this->ClearBoxArray(lev);
        this->ClearDistributionMap(lev);
    }

    finest_level = new_finest;

    //
    // Define the new grids from level start up to new_finest.
    //
    for(int lev = start; lev <= new_finest; ++lev) {
        //
        // Construct skeleton of new level.
        //

        if (loadbalance_with_workestimates && !initial) {
            new_dmap[lev] = makeLoadBalanceDistributionMap(lev, time, new_grid_places[lev]);
        }
        else if (new_dmap[lev].empty()) {
            new_dmap[lev].define(new_grid_places[lev]);
        }

        AmrLevel* a = (*levelbld)(*this,lev,Geom(lev),new_grid_places[lev],
                                  new_dmap[lev],cumtime);

        if (initial)
        {
            //
            // We're being called on startup from bldFineLevels().
            // NOTE: The initData function may use a filPatch, and so needs to
            //       be officially inserted into the hierarchy prior to the call.
            //
            amr_level[lev].reset(a);
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
            amr_level[lev]->initData();
        }
        else if (amr_level[lev])
        {
            //
            // Init with data from old structure then remove old structure.
            // NOTE: The init function may use a filPatch from the old level,
            //       which therefore needs remain in the hierarchy during the call.
            //
            a->init(*amr_level[lev]);
            amr_level[lev].reset(a);
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
        }
        else
        {
            a->init();
            amr_level[lev].reset(a);
            if (lev > 0)
                level_steps[lev] = level_steps[lev-1] * n_cycle[lev-1];
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
        }

    }


    //
    // Check at *all* levels whether we need to do anything special now that the grids
    //       at levels lbase+1 and higher may have changed.
    //
    for(int lev(0); lev <= new_finest; ++lev) {
        amr_level[lev]->post_regrid(lbase,new_finest);
    }

    //
    // Report creation of new grids.
    //

    if (record_run_info && ParallelDescriptor::IOProcessor())
    {
        runlog << "REGRID: at level lbase = " << lbase << '\n';
        printGridInfo(runlog,start,finest_level);
    }

    if (record_grid_info && ParallelDescriptor::IOProcessor())
    {
        if (lbase == 0)
            gridlog << "STEP = " << level_steps[0] << ' ';

        gridlog << "TIME = "
                << time
                << " : REGRID  with lbase = "
                << lbase
                << '\n';

        printGridInfo(gridlog,start,finest_level);
    }

    if (verbose > 0 && ParallelDescriptor::IOProcessor())
    {
        if (lbase == 0) {
            amrex::Print() << "STEP = " << level_steps[0] << ' ';
        }

        amrex::Print() << "TIME = "
                       << time
                       << " : REGRID  with lbase = "
                       << lbase
                       << std::endl;

        if (verbose > 1)
        {
            printGridInfo(amrex::OutStream(),start,finest_level);
        }
        else
        {
            printGridSummary(amrex::OutStream(),start,finest_level);
        }
    }
}